

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O2

void __thiscall Assimp::PlyExporter::WriteMeshIndices(PlyExporter *this,aiMesh *m,uint offset)

{
  aiFace *paVar1;
  ostream *poVar2;
  uint i;
  ulong uVar3;
  uint c;
  ulong uVar4;
  
  for (uVar3 = 0; uVar3 < m->mNumFaces; uVar3 = uVar3 + 1) {
    paVar1 = m->mFaces;
    std::ostream::_M_insert<unsigned_long>((ulong)this);
    for (uVar4 = 0; uVar4 < paVar1[uVar3].mNumIndices; uVar4 = uVar4 + 1) {
      poVar2 = std::operator<<((ostream *)this," ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    }
    std::operator<<((ostream *)this,(string *)&this->endl);
  }
  return;
}

Assistant:

void PlyExporter::WriteMeshIndices(const aiMesh* m, unsigned int offset)
{
    for (unsigned int i = 0; i < m->mNumFaces; ++i) {
        const aiFace& f = m->mFaces[i];
        mOutput << f.mNumIndices;
        for(unsigned int c = 0; c < f.mNumIndices; ++c) {
            mOutput << " " << (f.mIndices[c] + offset);
        }
        mOutput << endl;
    }
}